

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCommand.cpp
# Opt level: O3

double __thiscall PrintCommand::execute(PrintCommand *this)

{
  string *__k;
  double dVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *p_Var2;
  iterator iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar4;
  ostream *poVar5;
  
  p_Var2 = &DataBase::getInVarMap_abi_cxx11_(data)->_M_t;
  __k = &this->message;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
          ::find(p_Var2,__k);
  pmVar4 = DataBase::getInVarMap_abi_cxx11_(data);
  if ((_Rb_tree_header *)iVar3._M_node == &(pmVar4->_M_t)._M_impl.super__Rb_tree_header) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->message)._M_dataplus._M_p,
                        (this->message)._M_string_length);
  }
  else {
    p_Var2 = &DataBase::getInVarMap_abi_cxx11_(data)->_M_t;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            ::find(p_Var2,__k);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(iVar3._M_node + 1),
                        (long)iVar3._M_node[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    p_Var2 = &DataBase::getInVarMap_abi_cxx11_(data)->_M_t;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            ::find(p_Var2,__k);
    dVar1 = (double)(**(code **)**(undefined8 **)(iVar3._M_node + 2))();
    poVar5 = std::ostream::_M_insert<double>(dVar1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return 0.0;
}

Assistant:

double PrintCommand::execute() {
  if (data->getInVarMap()->find(this->message) != data->getInVarMap()->end()) {
    cout << data->getInVarMap()->find(this->message)->first <<
         ": " << data->getInVarMap()->find(this->message)->second->calculate()
         << endl;
  } else {
    cout << this->message << endl;
  }
  return 0;
}